

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

void __thiscall
QVarLengthArray<QDirSortItem,_64LL>::~QVarLengthArray(QVarLengthArray<QDirSortItem,_64LL> *this)

{
  undefined1 *ptr;
  
  std::_Destroy_n_aux<false>::__destroy_n<QDirSortItem*,long_long>
            ((QDirSortItem *)(this->super_QVLABase<QDirSortItem>).super_QVLABaseBase.ptr,
             (this->super_QVLABase<QDirSortItem>).super_QVLABaseBase.s);
  ptr = (undefined1 *)(this->super_QVLABase<QDirSortItem>).super_QVLABaseBase.ptr;
  if ((QVLAStorage<56UL,_8UL,_64LL> *)ptr != &this->super_QVLAStorage<56UL,_8UL,_64LL>) {
    QtPrivate::sizedFree(ptr,(this->super_QVLABase<QDirSortItem>).super_QVLABaseBase.a * 0x38);
    return;
  }
  return;
}

Assistant:

inline ~QVarLengthArray()
    {
        if constexpr (QTypeInfo<T>::isComplex)
            std::destroy_n(data(), size());
        if (data() != reinterpret_cast<T *>(this->array))
            QtPrivate::sizedFree(data(), capacity(), sizeof(T));
    }